

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_conn.cc
# Opt level: O2

void __thiscall iqxmlrpc::Server_connection::Server_connection(Server_connection *this,Inet_addr *a)

{
  sp_counted_base *psVar1;
  ulong in_RAX;
  undefined8 uStack_28;
  
  this->_vptr_Server_connection = (_func_int **)&PTR___cxa_pure_virtual_0019e5a0;
  (this->peer_addr)._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_0019be08;
  (this->peer_addr).impl_.px = (a->impl_).px;
  psVar1 = (a->impl_).pn.pi_;
  (this->peer_addr).impl_.pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  this->server = (Server *)0x0;
  uStack_28 = in_RAX;
  http::Packet_reader::Packet_reader(&this->preader);
  (this->response)._M_dataplus._M_p = (pointer)&(this->response).field_2;
  (this->response)._M_string_length = 0;
  (this->response).field_2._M_local_buf[0] = '\0';
  this->keep_alive = false;
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->read_buf_,0x10000,(value_type *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  return;
}

Assistant:

Server_connection::Server_connection( const iqnet::Inet_addr& a ):
  peer_addr(a),
  server(0),
  keep_alive(false),
  read_buf_(65536, '\0')
{
}